

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ParseSharpComment(AsciiParser *this)

{
  bool bVar1;
  char c;
  char local_9;
  
  bVar1 = Char1(this,&local_9);
  return bVar1 && local_9 == '#';
}

Assistant:

bool AsciiParser::ParseSharpComment() {
  char c;
  if (!Char1(&c)) {
    // eol
    return false;
  }

  if (c != '#') {
    return false;
  }

  return true;
}